

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_fader_set_fade(ma_fader *pFader,float volumeBeg,float volumeEnd,ma_uint64 lengthInFrames)

{
  ulong uVar1;
  ma_uint64 mVar2;
  
  if (pFader != (ma_fader *)0x0) {
    if (volumeBeg < 0.0) {
      uVar1 = pFader->cursorInFrames;
      if (uVar1 == 0) {
        volumeBeg = pFader->volumeBeg;
      }
      else if (uVar1 < pFader->lengthInFrames) {
        volumeBeg = (pFader->volumeEnd - pFader->volumeBeg) *
                    ((float)(uVar1 & 0xffffffff) / (float)(pFader->lengthInFrames & 0xffffffff)) +
                    pFader->volumeBeg;
      }
      else {
        volumeBeg = pFader->volumeEnd;
      }
    }
    mVar2 = 0xffffffff;
    if (lengthInFrames < 0xffffffff) {
      mVar2 = lengthInFrames;
    }
    pFader->volumeBeg = volumeBeg;
    pFader->volumeEnd = volumeEnd;
    pFader->lengthInFrames = mVar2;
    pFader->cursorInFrames = 0;
  }
  return;
}

Assistant:

MA_API void ma_fader_set_fade(ma_fader* pFader, float volumeBeg, float volumeEnd, ma_uint64 lengthInFrames)
{
    if (pFader == NULL) {
        return;
    }

    /* If the volume is negative, use current volume. */
    if (volumeBeg < 0) {
        volumeBeg = ma_fader_get_current_volume(pFader);
    }

    /*
    The length needs to be clamped to 32-bits due to how we convert it to a float for linear
    interpolation reasons. I might change this requirement later, but for now it's not important.
    */
    if (lengthInFrames > UINT_MAX) {
        lengthInFrames = UINT_MAX;
    }

    pFader->volumeBeg      = volumeBeg;
    pFader->volumeEnd      = volumeEnd;
    pFader->lengthInFrames = lengthInFrames;
    pFader->cursorInFrames = 0; /* Reset cursor. */
}